

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack_template.h
# Opt level: O3

int template_execute(template_context *ctx,char *data,size_t len,size_t *off)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined2 uVar3;
  ulong uVar4;
  msgpack_zone *pmVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  msgpack_object *pmVar15;
  void *pvVar16;
  uint *puVar17;
  undefined1 uVar18;
  double dVar19;
  msgpack_object **ppmVar20;
  msgpack_object *pmVar21;
  msgpack_object *unaff_RBX;
  msgpack_object_type mVar22;
  uint uVar23;
  msgpack_object_union *pmVar24;
  ulong uVar25;
  ulong uVar26;
  template_stack *ptVar27;
  long lVar28;
  ulong uVar29;
  ulong unaff_R12;
  ulong unaff_R13;
  uint uVar30;
  ulong uVar31;
  int unaff_R15D;
  msgpack_object *local_88;
  byte local_79;
  msgpack_object *local_78;
  double local_70;
  ulong local_40;
  
  uVar4 = *off;
  if (len < uVar4) {
    __assert_fail("len >= *off",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/msgpack/include/msgpack/unpack_template.h"
                  ,0x5b,
                  "int template_execute(struct template_context *, const char *, size_t, size_t *)")
    ;
  }
  local_78 = (msgpack_object *)(data + uVar4);
  uVar23 = ctx->cs;
  local_70 = (double)(ulong)ctx->trail;
  uVar30 = ctx->top;
  uVar31 = (ulong)uVar30;
  if (uVar4 != len) {
    pmVar21 = (msgpack_object *)(data + len);
    local_88 = (msgpack_object *)0x0;
    uVar11 = uVar23;
LAB_0014e05a:
    uVar30 = (uint)uVar31;
    pmVar15 = local_78;
    uVar23 = uVar11;
    if (uVar11 != 0) goto LAB_0014e369;
    uVar18 = (undefined1)local_78->type;
    dVar19 = (double)(ulong)(byte)uVar18;
    if (0x7f < (byte)uVar18 - 0x80) {
      unaff_R12 = 0;
      if ((char)uVar18 < '\0') {
        iVar14 = -1;
        uVar23 = 0;
        goto LAB_0014eb4f;
      }
      mVar22 = MSGPACK_OBJECT_POSITIVE_INTEGER;
      unaff_R13 = 0;
LAB_0014e350:
      uVar23 = 0;
      goto LAB_0014e978;
    }
    uVar11 = (uint)(byte)uVar18;
    switch((uint)(byte)uVar18) {
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
      uVar23 = 0;
      iVar14 = -2;
      if (uVar30 < 0x20) {
        uVar26 = uVar31 & 0xffffffff;
        ctx->stack[uVar26].obj.type = MSGPACK_OBJECT_MAP;
        ctx->stack[uVar26].obj.via.array.size = 0;
        uVar29 = (ulong)((uVar11 & 0xf) << 4) * 3;
        pmVar5 = (ctx->user).z;
        uVar4 = (pmVar5->chunk_list).free;
        pcVar6 = (pmVar5->chunk_list).ptr;
        pmVar15 = (msgpack_object *)((ulong)(pcVar6 + 7) & 0xfffffffffffffff8);
        uVar25 = (long)pmVar15 + (uVar29 - (long)pcVar6);
        if (uVar4 < uVar25) {
          pvVar16 = msgpack_zone_malloc_expand(pmVar5,uVar29 | 7);
          pmVar15 = (msgpack_object *)((ulong)pvVar16 & 0xfffffffffffffff8);
        }
        else {
          (pmVar5->chunk_list).free = uVar4 - uVar25;
          (pmVar5->chunk_list).ptr = pcVar6 + uVar25;
        }
        ptVar27 = ctx->stack + uVar26;
        (ptVar27->obj).via.array.ptr = pmVar15;
        uVar23 = 0;
        if (pmVar15 != (msgpack_object *)0x0) {
          if ((local_78->type & (MSGPACK_OBJECT_BIN|MSGPACK_OBJECT_MAP)) != MSGPACK_OBJECT_NIL) {
            ptVar27->ct = 1;
            goto LAB_0014e286;
          }
LAB_0014e299:
          mVar22 = (ptVar27->obj).type;
          unaff_R15D = *(int *)&(ptVar27->obj).field_0x4;
          dVar19 = (double)(ptVar27->obj).via.u64;
          unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
          unaff_R12 = (ulong)dVar19 >> 0x20;
          uVar23 = 0;
          unaff_RBX = pmVar15;
          break;
        }
      }
      else {
LAB_0014eb4f:
        uVar30 = (uint)uVar31;
      }
      goto switchD_0014e3bc_default;
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x96:
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
      uVar23 = 0;
      iVar14 = -2;
      if (0x1f < uVar30) goto LAB_0014eb4f;
      uVar26 = uVar31 & 0xffffffff;
      ctx->stack[uVar26].obj.type = MSGPACK_OBJECT_ARRAY;
      ctx->stack[uVar26].obj.via.array.size = 0;
      uVar29 = (ulong)((uVar11 & 0xf) << 3) * 3;
      pmVar5 = (ctx->user).z;
      uVar4 = (pmVar5->chunk_list).free;
      pcVar6 = (pmVar5->chunk_list).ptr;
      pmVar15 = (msgpack_object *)((ulong)(pcVar6 + 7) & 0xfffffffffffffff8);
      uVar25 = (long)pmVar15 + (uVar29 - (long)pcVar6);
      if (uVar4 < uVar25) {
        pvVar16 = msgpack_zone_malloc_expand(pmVar5,uVar29 | 7);
        pmVar15 = (msgpack_object *)((ulong)pvVar16 & 0xfffffffffffffff8);
      }
      else {
        (pmVar5->chunk_list).free = uVar4 - uVar25;
        (pmVar5->chunk_list).ptr = pcVar6 + uVar25;
      }
      ptVar27 = ctx->stack + uVar26;
      (ptVar27->obj).via.array.ptr = pmVar15;
      uVar23 = 0;
      if (pmVar15 != (msgpack_object *)0x0) {
        if ((local_78->type & (MSGPACK_OBJECT_BIN|MSGPACK_OBJECT_MAP)) == MSGPACK_OBJECT_NIL)
        goto LAB_0014e299;
        ptVar27->ct = 0;
LAB_0014e286:
        ptVar27->count = (ulong)((byte)(char)local_78->type & 0xf);
LAB_0014e855:
        uVar31 = (ulong)(uVar30 + 1);
        goto LAB_0014eadf;
      }
      goto switchD_0014e3bc_default;
    default:
      uVar12 = uVar11 & 0x1f;
      if ((uVar18 & 0x1f) != MSGPACK_OBJECT_NIL) {
        uVar13 = 0x20;
        goto LAB_0014e358;
      }
      uVar23 = 0;
      local_70 = 0.0;
LAB_0014e8aa:
      (ctx->user).referenced = true;
      mVar22 = MSGPACK_OBJECT_STR;
LAB_0014e8bd:
      unaff_R13 = (ulong)local_70 >> 8;
      dVar19 = local_70;
      unaff_RBX = local_88;
      break;
    case 0xc0:
    case 0xc1:
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
      uVar23 = 0;
      iVar14 = -1;
      uVar13 = 0x22;
      switch(uVar18) {
      case 0xc0:
        dVar19 = (double)(ulong)local_79;
        mVar22 = MSGPACK_OBJECT_NIL;
        goto LAB_0014e978;
      default:
        uVar23 = 0;
        goto switchD_0014e3bc_default;
      case 0xc2:
        dVar19 = 0.0;
        mVar22 = MSGPACK_OBJECT_BOOLEAN;
        goto LAB_0014e350;
      case 0xc3:
        mVar22 = MSGPACK_OBJECT_BOOLEAN;
        dVar19 = 4.94065645841247e-324;
        uVar23 = 0;
        goto LAB_0014e978;
      case 0xc4:
      case 0xc5:
      case 0xc6:
        uVar18 = uVar18 & MSGPACK_OBJECT_NEGATIVE_INTEGER;
        iVar14 = 1;
        break;
      case 199:
      case 200:
      case 0xc9:
        uVar18 = uVar18 + MSGPACK_OBJECT_BOOLEAN & MSGPACK_OBJECT_NEGATIVE_INTEGER;
        iVar14 = 1;
        break;
      case 0xca:
      case 0xcb:
      case 0xcc:
      case 0xcd:
      case 0xce:
      case 0xcf:
      case 0xd0:
      case 0xd1:
      case 0xd2:
      case 0xd3:
        uVar18 = uVar18 & MSGPACK_OBJECT_NEGATIVE_INTEGER;
        goto LAB_0014e2f9;
      case 0xd4:
      case 0xd5:
      case 0xd6:
      case 0xd7:
        uVar12 = (1 << (uVar18 & MSGPACK_OBJECT_NEGATIVE_INTEGER)) + 1;
        goto LAB_0014e358;
      case 0xd8:
        uVar12 = 0x11;
        goto LAB_0014e358;
      case 0xd9:
      case 0xda:
      case 0xdb:
        uVar18 = (uVar18 & MSGPACK_OBJECT_NEGATIVE_INTEGER) - MSGPACK_OBJECT_BOOLEAN;
LAB_0014e2f9:
        iVar14 = 1;
        break;
      case 0xdc:
      case 0xdd:
      case 0xde:
      case 0xdf:
        uVar18 = uVar18 & MSGPACK_OBJECT_BOOLEAN;
        iVar14 = 2;
      }
      uVar12 = iVar14 << (uVar18 & 0x1f);
      uVar13 = uVar11 & 0x1f;
LAB_0014e358:
      do {
        pmVar15 = (msgpack_object *)((long)&local_78->type + 1);
        local_70 = (double)(ulong)uVar12;
        uVar23 = uVar13;
LAB_0014e369:
        if ((ulong)((long)pmVar21 - (long)pmVar15) < (ulong)local_70) {
          iVar14 = 0;
          local_78 = pmVar15;
          goto switchD_0014e3bc_default;
        }
        local_78 = (msgpack_object *)((long)&pmVar15->type + (ulong)(local_70._0_4_ - 1));
        iVar14 = -1;
        uVar12 = 2;
        uVar13 = 0x22;
        local_88 = pmVar15;
        switch(uVar23) {
        case 4:
          uVar18 = (undefined1)pmVar15->type;
          uVar12 = (uint)(byte)uVar18;
          if (uVar18 == MSGPACK_OBJECT_NIL) {
LAB_0014e4f1:
            local_70 = 0.0;
            goto LAB_0014e4f8;
          }
          uVar13 = 0x21;
          break;
        case 5:
          uVar3 = (undefined2)pmVar15->type;
          uVar12 = (uint)(ushort)(uVar3 << 8 | (ushort)uVar3 >> 8);
          uVar13 = 0x21;
          if (uVar3 == MSGPACK_OBJECT_NIL) goto LAB_0014e4f1;
          break;
        case 6:
          mVar22 = pmVar15->type;
          uVar13 = 0x21;
          uVar12 = mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                   mVar22 << 0x18;
          if (mVar22 == MSGPACK_OBJECT_NIL) goto LAB_0014e4f1;
          break;
        case 7:
          uVar12 = (uint)(byte)(char)pmVar15->type;
          goto LAB_0014e533;
        case 8:
          uVar3 = (undefined2)pmVar15->type;
          uVar12 = (uint)(ushort)(uVar3 << 8 | (ushort)uVar3 >> 8);
LAB_0014e533:
          uVar12 = uVar12 + 1;
          break;
        case 9:
          mVar22 = pmVar15->type;
          uVar12 = (mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                   mVar22 << 0x18) + 1;
          if (uVar12 == 0) {
            local_70._0_4_ = 0;
            uVar23 = 9;
            goto LAB_0014eb4f;
          }
          break;
        case 10:
          goto switchD_0014e3bc_caseD_a;
        case 0xb:
          uVar4 = *(ulong *)pmVar15;
          uVar29 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                   (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8;
          dVar19 = (double)(uVar29 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
          unaff_R13 = uVar29 >> 8;
          unaff_R12 = (ulong)dVar19 >> 0x20;
          uVar23 = 0xb;
          mVar22 = MSGPACK_OBJECT_FLOAT;
          goto LAB_0014e978;
        case 0xc:
          dVar19 = (double)(ulong)(byte)(char)pmVar15->type;
          uVar23 = 0xc;
          unaff_R13 = 0;
          goto LAB_0014e7c1;
        case 0xd:
          uVar3 = (undefined2)pmVar15->type;
          dVar19 = (double)(ulong)((ushort)uVar3 >> 8);
          unaff_R13 = (ulong)(ushort)(uVar3 & 0xff);
          uVar23 = 0xd;
          goto LAB_0014e7c1;
        case 0xe:
          mVar22 = pmVar15->type;
          uVar23 = mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                   mVar22 << 0x18;
          dVar19 = (double)(ulong)uVar23;
          unaff_R13 = (ulong)(uVar23 >> 8);
          uVar23 = 0xe;
LAB_0014e7c1:
          mVar22 = MSGPACK_OBJECT_POSITIVE_INTEGER;
          unaff_R12 = 0;
          goto LAB_0014e978;
        case 0xf:
          uVar4 = *(ulong *)pmVar15;
          uVar29 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                   (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8;
          dVar19 = (double)(uVar29 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
          unaff_R13 = uVar29 >> 8;
          unaff_R12 = (ulong)dVar19 >> 0x20;
          uVar23 = 0xf;
          mVar22 = MSGPACK_OBJECT_POSITIVE_INTEGER;
          goto LAB_0014e978;
        case 0x10:
          uVar18 = (undefined1)pmVar15->type;
          dVar19 = (double)(long)(char)uVar18;
          mVar22 = -1 < (long)dVar19 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_R13 = (ulong)((uint)(int)(char)uVar18 >> 8);
          unaff_R12 = (ulong)dVar19 >> 0x20;
          uVar23 = 0x10;
          goto LAB_0014e978;
        case 0x11:
          uVar3 = (undefined2)pmVar15->type;
          uVar10 = uVar3 << 8 | (ushort)uVar3 >> 8;
          dVar19 = (double)(long)(short)uVar10;
          mVar22 = -1 < (short)uVar10 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_R13 = (ulong)((uint)(int)(short)uVar10 >> 8);
          unaff_R12 = (ulong)dVar19 >> 0x20;
          uVar23 = 0x11;
          goto LAB_0014e978;
        case 0x12:
          mVar22 = pmVar15->type;
          uVar23 = mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                   mVar22 << 0x18;
          dVar19 = (double)(long)(int)uVar23;
          if (-1 < (int)uVar23) {
            dVar19 = (double)(ulong)uVar23;
          }
          mVar22 = -1 < (int)uVar23 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
          unaff_R12 = (ulong)dVar19 >> 0x20;
          uVar23 = 0x12;
          goto LAB_0014e978;
        case 0x13:
          uVar4 = *(ulong *)pmVar15;
          uVar29 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                   (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8;
          dVar19 = (double)(uVar29 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
          mVar22 = -1 < (long)dVar19 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
          unaff_R13 = uVar29 >> 8;
          unaff_R12 = (ulong)dVar19 >> 0x20;
          uVar23 = 0x13;
          goto LAB_0014e978;
        case 0x14:
          break;
        case 0x15:
          uVar12 = 3;
          break;
        case 0x16:
          uVar12 = 5;
          break;
        case 0x17:
          uVar12 = 9;
          break;
        case 0x18:
          uVar12 = 0x11;
          break;
        case 0x19:
          uVar18 = (undefined1)pmVar15->type;
          uVar12 = (uint)(byte)uVar18;
          if (uVar18 == MSGPACK_OBJECT_NIL) {
            uVar23 = 0x19;
LAB_0014e8a5:
            local_70 = 0.0;
            goto LAB_0014e8aa;
          }
          uVar13 = 0x20;
          break;
        case 0x1a:
          uVar3 = (undefined2)pmVar15->type;
          uVar12 = (uint)(ushort)(uVar3 << 8 | (ushort)uVar3 >> 8);
          uVar13 = 0x20;
          if (uVar3 == MSGPACK_OBJECT_NIL) {
            uVar23 = 0x1a;
            goto LAB_0014e8a5;
          }
          break;
        case 0x1b:
          mVar22 = pmVar15->type;
          uVar13 = 0x20;
          uVar12 = mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                   mVar22 << 0x18;
          if (mVar22 == MSGPACK_OBJECT_NIL) {
            uVar23 = 0x1b;
            goto LAB_0014e8a5;
          }
          break;
        case 0x1c:
          uVar23 = 0x1c;
          if (0x1f < uVar30) goto LAB_0014eb89;
          uVar3 = (undefined2)pmVar15->type;
          uVar10 = uVar3 << 8 | (ushort)uVar3 >> 8;
          pmVar15 = &ctx->stack[uVar31 & 0xffffffff].obj;
          iVar14 = template_callback_array(&ctx->user,(uint)uVar10,pmVar15);
          if (iVar14 < 0) {
            uVar23 = 0x1c;
            goto switchD_0014e3bc_default;
          }
          if (uVar3 == MSGPACK_OBJECT_NIL) {
            mVar22 = pmVar15->type;
            unaff_R15D = *(int *)&pmVar15->field_0x4;
            dVar19 = (double)(pmVar15->via).u64;
            unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
            unaff_R12 = (ulong)dVar19 >> 0x20;
            unaff_RBX = (pmVar15->via).array.ptr;
            uVar23 = 0x1c;
            goto LAB_0014e978;
          }
          pmVar15[1].via.array.size = 0;
LAB_0014e64e:
          local_40 = (ulong)uVar10;
          *(ulong *)(pmVar15 + 1) = local_40;
          goto LAB_0014e855;
        case 0x1d:
          uVar23 = 0x1d;
          if (0x1f < uVar30) goto LAB_0014eb89;
          mVar22 = pmVar15->type;
          uVar23 = mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                   mVar22 << 0x18;
          pmVar15 = &ctx->stack[uVar31 & 0xffffffff].obj;
          iVar14 = template_callback_array(&ctx->user,uVar23,pmVar15);
          if (iVar14 < 0) {
            uVar23 = 0x1d;
            goto switchD_0014e3bc_default;
          }
          if (mVar22 == MSGPACK_OBJECT_NIL) {
            mVar22 = pmVar15->type;
            unaff_R15D = *(int *)&pmVar15->field_0x4;
            dVar19 = (double)(pmVar15->via).u64;
            unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
            unaff_R12 = (ulong)dVar19 >> 0x20;
            unaff_RBX = (pmVar15->via).array.ptr;
            uVar23 = 0x1d;
            goto LAB_0014e978;
          }
          pmVar15[1].via.array.size = 0;
LAB_0014e845:
          local_40 = (ulong)uVar23;
          *(ulong *)(pmVar15 + 1) = local_40;
          goto LAB_0014e855;
        case 0x1e:
          uVar23 = 0x1e;
          if (0x1f < uVar30) goto LAB_0014eb89;
          uVar3 = (undefined2)pmVar15->type;
          uVar10 = uVar3 << 8 | (ushort)uVar3 >> 8;
          pmVar15 = &ctx->stack[uVar31 & 0xffffffff].obj;
          iVar14 = template_callback_map(&ctx->user,(uint)uVar10,pmVar15);
          if (iVar14 < 0) {
            uVar23 = 0x1e;
            goto switchD_0014e3bc_default;
          }
          if (uVar3 != MSGPACK_OBJECT_NIL) {
            pmVar15[1].via.array.size = 1;
            goto LAB_0014e64e;
          }
          mVar22 = pmVar15->type;
          unaff_R15D = *(int *)&pmVar15->field_0x4;
          dVar19 = (double)(pmVar15->via).u64;
          unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
          unaff_R12 = (ulong)dVar19 >> 0x20;
          unaff_RBX = (pmVar15->via).array.ptr;
          uVar23 = 0x1e;
          goto LAB_0014e978;
        case 0x1f:
          uVar23 = 0x1f;
          if (0x1f < uVar30) {
LAB_0014eb89:
            iVar14 = -2;
            goto LAB_0014eb4f;
          }
          mVar22 = pmVar15->type;
          uVar23 = mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                   mVar22 << 0x18;
          pmVar15 = &ctx->stack[uVar31 & 0xffffffff].obj;
          iVar14 = template_callback_map(&ctx->user,uVar23,pmVar15);
          if (iVar14 < 0) {
            uVar23 = 0x1f;
            goto switchD_0014e3bc_default;
          }
          if (mVar22 != MSGPACK_OBJECT_NIL) {
            pmVar15[1].via.array.size = 1;
            goto LAB_0014e845;
          }
          mVar22 = pmVar15->type;
          unaff_R15D = *(int *)&pmVar15->field_0x4;
          dVar19 = (double)(pmVar15->via).u64;
          unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
          unaff_R12 = (ulong)dVar19 >> 0x20;
          unaff_RBX = (pmVar15->via).array.ptr;
          uVar23 = 0x1f;
          goto LAB_0014e978;
        case 0x20:
          goto LAB_0014e8aa;
        case 0x21:
LAB_0014e4f8:
          (ctx->user).referenced = true;
          mVar22 = MSGPACK_OBJECT_BIN;
          goto LAB_0014e8bd;
        case 0x22:
          if (local_70._0_4_ != 0) {
            dVar19 = (double)(ulong)(byte)(char)pmVar15->type;
            unaff_RBX = (msgpack_object *)((long)&pmVar15->type + 1);
            (ctx->user).referenced = true;
            uVar23 = 0x22;
            mVar22 = MSGPACK_OBJECT_EXT;
            unaff_R12 = (ulong)(local_70._0_4_ - 1);
            goto LAB_0014e978;
          }
          local_70._0_4_ = 0;
          uVar23 = 0x22;
          goto LAB_0014eb4f;
        default:
          goto switchD_0014e3bc_default;
        }
      } while( true );
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
    case 0xfe:
    case 0xff:
      mVar22 = MSGPACK_OBJECT_NEGATIVE_INTEGER;
      unaff_R12 = 0xffffffff;
      unaff_R13 = 0xffffff;
      uVar23 = 0;
    }
    goto LAB_0014e978;
  }
  iVar14 = 0;
  local_70._0_4_ = ctx->trail;
switchD_0014e3bc_default:
  ctx->cs = uVar23;
  ctx->trail = local_70._0_4_;
  ctx->top = uVar30;
  *off = (long)local_78 - (long)data;
  return iVar14;
switchD_0014e3bc_caseD_a:
  mVar22 = pmVar15->type;
  dVar19 = (double)(float)(mVar22 >> 0x18 | (mVar22 & 0xff0000) >> 8 | (mVar22 & 0xff00) << 8 |
                          mVar22 << 0x18);
  unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
  unaff_R12 = (ulong)dVar19 >> 0x20;
  mVar22 = MSGPACK_OBJECT_FLOAT32;
  uVar23 = 10;
LAB_0014e978:
  iVar14 = (int)unaff_R13;
  if (uVar30 != 0) {
    puVar17 = &ctx->stack[(uVar31 & 0xffffffff) - 1].ct;
    uVar31 = uVar31 & 0xffffffff;
    do {
      uVar4 = uVar31 - 1;
      uVar30 = *puVar17;
      iVar14 = (int)unaff_R13;
      local_79 = SUB81(dVar19,0);
      if (uVar30 == 0) {
        lVar7 = *(long *)(puVar17 + -4);
        uVar29 = (ulong)(((msgpack_object_union *)(puVar17 + -6))->array).size;
        *(msgpack_object_type *)(lVar7 + uVar29 * 0x18) = mVar22;
        *(int *)(lVar7 + 4 + uVar29 * 0x18) = unaff_R15D;
        *(ulong *)(lVar7 + 8 + uVar29 * 0x18) =
             unaff_R12 << 0x20 | (ulong)dVar19 & 0xff | (ulong)(uint)(iVar14 << 8);
        *(msgpack_object **)(lVar7 + 0x10 + uVar29 * 0x18) = unaff_RBX;
        (((msgpack_object_union *)(puVar17 + -6))->array).size =
             (((msgpack_object_union *)(puVar17 + -6))->array).size + 1;
        psVar1 = (size_t *)(puVar17 + -2);
        *psVar1 = *psVar1 - 1;
        if (*psVar1 != 0) goto LAB_0014eadf;
        pmVar24 = &ctx->stack[uVar31 - 1].obj.via;
        ppmVar20 = &ctx->stack[uVar31 - 1].obj.via.array.ptr;
      }
      else {
        if (uVar30 != 2) {
          if (uVar30 == 1) {
            ((msgpack_object *)(puVar17 + 2))->type = mVar22;
            puVar17[3] = unaff_R15D;
            ((msgpack_object_union *)(puVar17 + 4))->u64 =
                 unaff_R12 << 0x20 | (ulong)dVar19 & 0xff | (ulong)(uint)(iVar14 << 8);
            *(msgpack_object **)(puVar17 + 6) = unaff_RBX;
            *puVar17 = 2;
            goto LAB_0014eadf;
          }
          iVar14 = -1;
          goto LAB_0014eb4f;
        }
        lVar7 = *(long *)(puVar17 + -4);
        lVar28 = (ulong)(((msgpack_object_union *)(puVar17 + -6))->array).size * 0x30;
        uVar8 = *(undefined8 *)(puVar17 + 2);
        uVar9 = ((msgpack_object_union *)(puVar17 + 4))->u64;
        *(undefined8 *)(lVar7 + 0x10 + lVar28) = *(undefined8 *)(puVar17 + 6);
        puVar2 = (undefined8 *)(lVar7 + lVar28);
        *puVar2 = uVar8;
        puVar2[1] = uVar9;
        lVar7 = *(long *)(puVar17 + -4);
        lVar28 = (ulong)(((msgpack_object_union *)(puVar17 + -6))->array).size * 0x30;
        *(msgpack_object_type *)(lVar7 + 0x18 + lVar28) = mVar22;
        *(int *)(lVar7 + 0x1c + lVar28) = unaff_R15D;
        *(ulong *)(lVar7 + 0x20 + lVar28) =
             unaff_R12 << 0x20 | (ulong)dVar19 & 0xff | (ulong)(uint)(iVar14 << 8);
        *(msgpack_object **)(lVar7 + 0x28 + lVar28) = unaff_RBX;
        (((msgpack_object_union *)(puVar17 + -6))->array).size =
             (((msgpack_object_union *)(puVar17 + -6))->array).size + 1;
        psVar1 = (size_t *)(puVar17 + -2);
        *psVar1 = *psVar1 - 1;
        if (*psVar1 != 0) goto LAB_0014eacb;
        pmVar24 = (msgpack_object_union *)(puVar17 + -6);
        ppmVar20 = (msgpack_object **)(puVar17 + -4);
      }
      mVar22 = (((template_stack *)(puVar17 + -8))->obj).type;
      unaff_R15D = puVar17[-7];
      unaff_RBX = *ppmVar20;
      dVar19 = (double)pmVar24->u64;
      unaff_R12 = (ulong)dVar19 >> 0x20;
      unaff_R13 = (ulong)dVar19 >> 8 & 0xffffff;
      iVar14 = (int)unaff_R13;
      puVar17 = puVar17 + -0x10;
      uVar31 = uVar4;
      if (uVar4 == 0) break;
    } while( true );
  }
  ctx->stack[0].obj.type = mVar22;
  *(int *)&ctx->stack[0].obj.field_0x4 = unaff_R15D;
  ctx->stack[0].obj.via.u64 = unaff_R12 << 0x20 | (ulong)dVar19 & 0xff | (ulong)(uint)(iVar14 << 8);
  ctx->stack[0].obj.via.array.ptr = unaff_RBX;
  uVar30 = 0;
  iVar14 = 1;
  local_78 = (msgpack_object *)((long)&local_78->type + 1);
  goto switchD_0014e3bc_default;
LAB_0014eacb:
  *puVar17 = 1;
LAB_0014eadf:
  uVar30 = (uint)uVar31;
  local_78 = (msgpack_object *)((long)&local_78->type + 1);
  uVar11 = 0;
  uVar23 = 0;
  if (local_78 == pmVar21) goto code_r0x0014eaf8;
  goto LAB_0014e05a;
code_r0x0014eaf8:
  iVar14 = 0;
  local_78 = pmVar21;
  goto switchD_0014e3bc_default;
}

Assistant:

msgpack_unpack_func(int, _execute)(msgpack_unpack_struct(_context)* ctx, const char* data, size_t len, size_t* off)
{
    assert(len >= *off);
    {
        const unsigned char* p = (unsigned char*)data + *off;
        const unsigned char* const pe = (unsigned char*)data + len;
        const void* n = NULL;

        unsigned int trail = ctx->trail;
        unsigned int cs = ctx->cs;
        unsigned int top = ctx->top;
        msgpack_unpack_struct(_stack)* stack = ctx->stack;
        /*
        unsigned int stack_size = ctx->stack_size;
        */
        msgpack_unpack_user* user = &ctx->user;

        msgpack_unpack_object obj;
        msgpack_unpack_struct(_stack)* c = NULL;

        int ret;

#define push_simple_value(func) \
        ret = msgpack_unpack_callback(func)(user, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_fixed_value(func, arg) \
        ret = msgpack_unpack_callback(func)(user, arg, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_variable_value(func, base, pos, len) \
        ret = msgpack_unpack_callback(func)(user, \
            (const char*)base, (const char*)pos, len, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push

#define again_fixed_trail(_cs, trail_len) \
        trail = trail_len; \
        cs = _cs; \
        goto _fixed_trail_again
#define again_fixed_trail_if_zero(_cs, trail_len, ifzero) \
        trail = trail_len; \
        if(trail == 0) { goto ifzero; } \
        cs = _cs; \
        goto _fixed_trail_again

#define start_container(func, count_, ct_) \
        if(top >= MSGPACK_EMBED_STACK_SIZE) { \
            ret = MSGPACK_UNPACK_NOMEM_ERROR; \
            goto _failed; \
        } /* FIXME */ \
        ret = msgpack_unpack_callback(func)(user, count_, &stack[top].obj); \
        if(ret < 0) { goto _failed; } \
        if((count_) == 0) { obj = stack[top].obj; goto _push; } \
        stack[top].ct = ct_; \
        stack[top].count = count_; \
        ++top; \
        goto _header_again

#define NEXT_CS(p) \
        ((unsigned int)*p & 0x1f)

#ifdef USE_CASE_RANGE
#define SWITCH_RANGE_BEGIN     switch(*p) {
#define SWITCH_RANGE(FROM, TO) case FROM ... TO:
#define SWITCH_RANGE_DEFAULT   default:
#define SWITCH_RANGE_END       }
#else
#define SWITCH_RANGE_BEGIN     { if(0) {
#define SWITCH_RANGE(FROM, TO) } else if(FROM <= *p && *p <= TO) {
#define SWITCH_RANGE_DEFAULT   } else {
#define SWITCH_RANGE_END       } }
#endif

        if(p == pe) { goto _out; }
        do {
            switch(cs) {
            case MSGPACK_CS_HEADER:
                SWITCH_RANGE_BEGIN
                SWITCH_RANGE(0x00, 0x7f)  // Positive Fixnum
                    push_fixed_value(_uint8, *(uint8_t*)p);
                SWITCH_RANGE(0xe0, 0xff)  // Negative Fixnum
                    push_fixed_value(_int8, *(int8_t*)p);
                SWITCH_RANGE(0xc0, 0xdf)  // Variable
                    switch(*p) {
                    case 0xc0:  // nil
                        push_simple_value(_nil);
                    //case 0xc1:  // string
                    //  again_terminal_trail(NEXT_CS(p), p+1);
                    case 0xc2:  // false
                        push_simple_value(_false);
                    case 0xc3:  // true
                        push_simple_value(_true);
                    case 0xc4: // bin 8
                    case 0xc5: // bin 16
                    case 0xc6: // bin 32
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xc7: // ext 8
                    case 0xc8: // ext 16
                    case 0xc9: // ext 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) + 1) & 0x03));
                    case 0xca:  // float
                    case 0xcb:  // double
                    case 0xcc:  // unsigned int  8
                    case 0xcd:  // unsigned int 16
                    case 0xce:  // unsigned int 32
                    case 0xcf:  // unsigned int 64
                    case 0xd0:  // signed int  8
                    case 0xd1:  // signed int 16
                    case 0xd2:  // signed int 32
                    case 0xd3:  // signed int 64
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xd4:  // fixext 1
                    case 0xd5:  // fixext 2
                    case 0xd6:  // fixext 4
                    case 0xd7:  // fixext 8
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE,
                            (1 << (((unsigned int)*p) & 0x03)) + 1, _ext_zero);
                    case 0xd8:  // fixext 16
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);

                    case 0xd9:  // str 8
                    case 0xda:  // str 16
                    case 0xdb:  // str 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) & 0x03) - 1));
                    case 0xdc:  // array 16
                    case 0xdd:  // array 32
                    case 0xde:  // map 16
                    case 0xdf:  // map 32
                        again_fixed_trail(NEXT_CS(p), 2u << (((unsigned int)*p) & 0x01));
                    default:
                        ret = MSGPACK_UNPACK_PARSE_ERROR;
                        goto _failed;
                    }
                SWITCH_RANGE(0xa0, 0xbf)  // FixStr
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, ((unsigned int)*p & 0x1f), _str_zero);
                SWITCH_RANGE(0x90, 0x9f)  // FixArray
                    start_container(_array, ((unsigned int)*p) & 0x0f, MSGPACK_CT_ARRAY_ITEM);
                SWITCH_RANGE(0x80, 0x8f)  // FixMap
                    start_container(_map, ((unsigned int)*p) & 0x0f, MSGPACK_CT_MAP_KEY);

                SWITCH_RANGE_DEFAULT
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                SWITCH_RANGE_END
                // end MSGPACK_CS_HEADER


            _fixed_trail_again:
                ++p;

            default:
                if((size_t)(pe - p) < trail) { goto _out; }
                n = p;  p += trail - 1;
                switch(cs) {
                //case MSGPACK_CS_
                //case MSGPACK_CS_
                case MSGPACK_CS_FLOAT: {
                        union { uint32_t i; float f; } mem;
                        _msgpack_load32(uint32_t, n, &mem.i);
                        push_fixed_value(_float, mem.f); }
                case MSGPACK_CS_DOUBLE: {
                        union { uint64_t i; double f; } mem;
                        _msgpack_load64(uint64_t, n, &mem.i);
#if defined(TARGET_OS_IPHONE)
                    // ok
#elif defined(__arm__) && !(__ARM_EABI__) // arm-oabi
                        // https://github.com/msgpack/msgpack-perl/pull/1
                        mem.i = (mem.i & 0xFFFFFFFFUL) << 32UL | (mem.i >> 32UL);
#endif
                        push_fixed_value(_double, mem.f); }
                case MSGPACK_CS_UINT_8:
                    push_fixed_value(_uint8, *(uint8_t*)n);
                case MSGPACK_CS_UINT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    push_fixed_value(_uint16, tmp);
                }
                case MSGPACK_CS_UINT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    push_fixed_value(_uint32, tmp);
                }
                case MSGPACK_CS_UINT_64:{
                    uint64_t tmp;
                    _msgpack_load64(uint64_t,n,&tmp);
                    push_fixed_value(_uint64, tmp);
                }
                case MSGPACK_CS_INT_8:
                    push_fixed_value(_int8, *(int8_t*)n);
                case MSGPACK_CS_INT_16:{
                    int16_t tmp;
                    _msgpack_load16(int16_t,n,&tmp);
                    push_fixed_value(_int16, tmp);
                }
                case MSGPACK_CS_INT_32:{
                    int32_t tmp;
                    _msgpack_load32(int32_t,n,&tmp);
                    push_fixed_value(_int32, tmp);
                }
                case MSGPACK_CS_INT_64:{
                    int64_t tmp;
                    _msgpack_load64(int64_t,n,&tmp);
                    push_fixed_value(_int64, tmp);
                }
                case MSGPACK_CS_FIXEXT_1:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 1+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_2:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 2+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_4:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 4+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 8+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_16:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);
                case MSGPACK_CS_STR_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, *(uint8_t*)n, _str_zero);
                case MSGPACK_CS_BIN_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, *(uint8_t*)n, _bin_zero);
                case MSGPACK_CS_EXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, (*(uint8_t*)n) + 1, _ext_zero);
                case MSGPACK_CS_STR_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_CS_STR_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_ACS_STR_VALUE:
                _str_zero:
                    push_variable_value(_str, data, n, trail);
                case MSGPACK_ACS_BIN_VALUE:
                _bin_zero:
                    push_variable_value(_bin, data, n, trail);
                case MSGPACK_ACS_EXT_VALUE:
                _ext_zero:
                    push_variable_value(_ext, data, n, trail);

                case MSGPACK_CS_ARRAY_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }
                case MSGPACK_CS_ARRAY_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }

                case MSGPACK_CS_MAP_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }
                case MSGPACK_CS_MAP_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }

                default:
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                }
            }

    _push:
        if(top == 0) { goto _finish; }
        c = &stack[top-1];
        switch(c->ct) {
        case MSGPACK_CT_ARRAY_ITEM:
            ret = msgpack_unpack_callback(_array_item)(user, &c->obj, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            goto _header_again;
        case MSGPACK_CT_MAP_KEY:
            c->map_key = obj;
            c->ct = MSGPACK_CT_MAP_VALUE;
            goto _header_again;
        case MSGPACK_CT_MAP_VALUE:
            ret = msgpack_unpack_callback(_map_item)(user, &c->obj, c->map_key, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            c->ct = MSGPACK_CT_MAP_KEY;
            goto _header_again;

        default:
            ret = MSGPACK_UNPACK_PARSE_ERROR;
            goto _failed;
        }

    _header_again:
            cs = MSGPACK_CS_HEADER;
            ++p;
        } while(p != pe);
        goto _out;


    _finish:
        stack[0].obj = obj;
        ++p;
        ret = 1;
        /*printf("-- finish --\n"); */
        goto _end;

    _failed:
        /*printf("** FAILED **\n"); */
        goto _end;

    _out:
        ret = 0;
        goto _end;

    _end:
        ctx->cs = cs;
        ctx->trail = trail;
        ctx->top = top;
        *off = (size_t)(p - (const unsigned char*)data);

        return ret;
    }
}